

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

int setup_vischar_plotting(tgestate_t *state,vischar_t *vischar)

{
  ushort uVar1;
  spritedef_t *psVar2;
  size_t sVar3;
  uint8_t *puVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  size_t *psVar8;
  ulong uVar9;
  uint uVar10;
  byte bVar11;
  uint8_t uVar12;
  byte bVar13;
  bool bVar14;
  uint8_t clipped_height;
  uint8_t top_skip;
  uint8_t clipped_width;
  uint8_t left_skip;
  attribute_t local_1c;
  byte local_1b;
  uint8_t local_1a;
  uint8_t local_19;
  
  uVar1 = (vischar->mi).mappos.u;
  if (state->room_index == '\0') {
    (state->mappos_stash).u = (uint8_t)(uVar1 + 4 >> 3);
    (state->mappos_stash).v = (uint8_t)((vischar->mi).mappos.v >> 3);
    uVar12 = (uint8_t)((vischar->mi).mappos.w >> 3);
  }
  else {
    (state->mappos_stash).u = (uint8_t)uVar1;
    (state->mappos_stash).v = (uint8_t)(vischar->mi).mappos.v;
    uVar12 = (uint8_t)(vischar->mi).mappos.w;
  }
  (state->mappos_stash).w = uVar12;
  psVar2 = (vischar->mi).sprite;
  bVar11 = (vischar->mi).sprite_index;
  state->sprite_index = bVar11;
  (state->isopos).x = (uint8_t)((vischar->isopos).x >> 3);
  (state->isopos).y = (uint8_t)((vischar->isopos).y >> 3);
  uVar10 = bVar11 & 0x7f;
  uVar12 = psVar2[uVar10].width;
  vischar->width_bytes = uVar12;
  vischar->height = psVar2[uVar10].height;
  puVar4 = (&psVar2[uVar10].bitmap)[1];
  state->bitmap_pointer = psVar2[uVar10].bitmap;
  state->mask_pointer = puVar4;
  iVar6 = vischar_visible(state,vischar,&local_19,&local_1a,&local_1b,&local_1c);
  iVar7 = 0;
  if (iVar6 == 0) {
    bVar14 = uVar12 == '\x03';
    psVar8 = setup_vischar_plotting::masked_sprite_plotter_24_enables;
    if (bVar14) {
      psVar8 = masked_sprite_plotter_16_enables;
    }
    state->item_attributes[(ulong)bVar14 * 2 + 0x10] = local_1c;
    state->item_attributes[(ulong)bVar14 * 2 + 0x11] = local_1c;
    bVar11 = 0;
    uVar12 = (4U - bVar14) - local_1a;
    if (local_19 == '\0') {
      uVar12 = local_1a;
    }
    bVar13 = 0x77;
    if (local_19 != '\0') {
      bVar13 = bVar11;
    }
    do {
      sVar3 = psVar8[1];
      *(byte *)((long)state->jmpbuf_main[0].__jmpbuf + (*psVar8 - 0x20)) = bVar13;
      *(byte *)((long)state->jmpbuf_main[0].__jmpbuf + (sVar3 - 0x20)) = bVar13;
      bVar5 = bVar13 ^ 0x77;
      if ((byte)(uVar12 - 1) != bVar11) {
        bVar5 = bVar13;
      }
      bVar13 = bVar5;
      bVar11 = bVar11 + 1;
      psVar8 = psVar8 + 2;
    } while ((byte)(4U - bVar14) != bVar11);
    uVar9 = (ulong)local_1b;
    uVar10 = 0;
    if (uVar9 == 0) {
      uVar10 = ((uint)(vischar->isopos).y + (uint)(state->map_position).y * -8) * state->columns &
               0xffff;
    }
    state->window_buf_pointer =
         state->window_buf +
         (((ulong)uVar10 + (ulong)(state->isopos).x) - (ulong)(state->map_position).x);
    state->foreground_mask_pointer =
         state->mask_buffer + (ulong)((vischar->isopos).y & 7) * 4 + uVar9 * 4;
    if (uVar9 == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = (ulong)(byte)((vischar->width_bytes + 0xff) * local_1b);
    }
    state->bitmap_pointer = state->bitmap_pointer + uVar9;
    state->mask_pointer = state->mask_pointer + uVar9;
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

int setup_vischar_plotting(tgestate_t *state, vischar_t *vischar)
{
  /**
   * $E0EC: Addresses of self-modified locations which are changed between
   * NOPs and LD (HL),A.
   */
  static const size_t masked_sprite_plotter_24_enables[4 * 2] =
  {
    offsetof(tgestate_t, spriteplotter.enable_24_right_1),
    offsetof(tgestate_t, spriteplotter.enable_24_left_1),
    offsetof(tgestate_t, spriteplotter.enable_24_right_2),
    offsetof(tgestate_t, spriteplotter.enable_24_left_2),
    offsetof(tgestate_t, spriteplotter.enable_24_right_3),
    offsetof(tgestate_t, spriteplotter.enable_24_left_3),
    offsetof(tgestate_t, spriteplotter.enable_24_right_4),
    offsetof(tgestate_t, spriteplotter.enable_24_left_4),

    /* These two addresses are present here in the original game but are
     * unreferenced. */
    // masked_sprite_plotter_16_wide_vischar
    // masked_sprite_plotter_24_wide_vischar
  };

  mappos16_t        *vischar_pos;    /* was HL */
  mappos8_t         *mappos_stash;   /* was DE */
  const spritedef_t *sprite;         /* was BC */
  spriteindex_t      sprite_index;   /* was A */
  const spritedef_t *sprite2;        /* was DE */
  uint8_t            left_skip;      /* was B */
  uint8_t            clipped_width;  /* was C */
  uint8_t            top_skip;       /* was D */
  uint8_t            clipped_height; /* was E */
  const size_t      *enables;        /* was HL */
  uint8_t            enable_count;   /* was $E4C0 */
  uint8_t            counter;        /* was A' */
  uint8_t            iters;          /* was B' */
  uint8_t            instr;          /* was A */
  uint8_t            A;              /* was A */
  int16_t            x;              /* was HL */
  uint8_t           *maskbuf;        /* was HL */
  uint16_t           y;              /* was DE */
  uint16_t           skip;           /* was DE */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  vischar_pos  = &vischar->mi.mappos;
  mappos_stash = &state->mappos_stash;

  if (state->room_index > room_0_OUTDOORS)
  {
    /* Indoors. */
    mappos_stash->u = vischar_pos->u; // note: narrowing
    mappos_stash->v = vischar_pos->v; // note: narrowing
    mappos_stash->w = vischar_pos->w; // note: narrowing
  }
  else
  {
    /* Outdoors. */
    /* Conv: Unrolled, removed divide-by-8 calls. */
    mappos_stash->u = (vischar_pos->u + 4) >> 3; /* with rounding */
    mappos_stash->v = (vischar_pos->v    ) >> 3; /* without rounding */
    mappos_stash->w = (vischar_pos->w    ) >> 3;
  }

  sprite = vischar->mi.sprite;

  // banked in A'
  state->sprite_index = sprite_index = vischar->mi.sprite_index; // set left/right flip flag / sprite offset

  // HL now points after sprite_index, at isopos
  // DE now points to state->isopos.x

  // unrolled versus original
  state->isopos.x = vischar->isopos.x >> 3;
  state->isopos.y = vischar->isopos.y >> 3;
  // 'isopos' here is now a scaled-down projected map coordinate

  // A is (1<<7) mask OR sprite offset
  // original game uses ADD A,A to double A and in doing so discards top bit, here we mask it off explicitly
  sprite2 = &sprite[sprite_index & ~sprite_FLAG_FLIP]; // sprite pointer

  vischar->width_bytes = sprite2->width;  /* width in bytes + 1 */
  vischar->height      = sprite2->height; /* height in rows */

  state->bitmap_pointer = sprite2->bitmap;
  state->mask_pointer   = sprite2->mask;

  if (vischar_visible(state,
                      vischar,
                     &left_skip,
                     &clipped_width,
                     &top_skip,
                     &clipped_height)) // used A as temporary
    return 0; /* invisible */

  // PUSH clipped_width
  // PUSH clipped_height

  assert(clipped_width < 100);
  assert(clipped_height < 100);

  if (vischar->width_bytes == 3) // 3 => 16 wide, 4 => 24 wide
  {
    state->spriteplotter.height_16_left  = clipped_height; // self modify masked_sprite_plotter_16_wide_left
    state->spriteplotter.height_16_right = clipped_height; // self-modify masked_sprite_plotter_16_wide_right

    enable_count = 3;
    enables = &masked_sprite_plotter_16_enables[0];
  }
  else
  {
    state->spriteplotter.height_24_right = clipped_height; // self-modify masked_sprite_plotter_24_wide_vischar (shift right case)
    state->spriteplotter.height_24_left  = clipped_height; // self-modify masked_sprite_plotter_24_wide_vischar (shift left case)

    enable_count = 4;
    enables = &masked_sprite_plotter_24_enables[0];
  }

  // PUSH HL_enables

  // enable_count = A; // self-modify
  // E = A
  // A = B
  if (left_skip == 0) // no lefthand skip: start with 'on'
  {
    instr = 119; /* opcode of 'LD (HL),A' */
    counter = clipped_width; // process this many bytes before clipping
  }
  else // lefthand skip present: start with 'off'
  {
    instr = 0; /* opcode of 'NOP' */
    counter = enable_count - clipped_width; // clip until this many bytes have been processed
  }

  // EXX
  // POP HL_enables

  /* Set the addresses in the jump table to NOP or LD (HL),A. */
  //Cdash = offset; // must be no of columns?
  iters = enable_count; /* 3 or 4 iterations */
  do
  {
    *(((uint8_t *) state) + *enables++) = instr;
    *(((uint8_t *) state) + *enables++) = instr;
    if (--counter == 0)
      instr ^= 119; /* Toggle between LD and NOP. */
  }
  while (--iters);

  // EXX

  assert(vischar->isopos.y / 8 - state->map_position.y < state->rows);
  assert(vischar->isopos.y / 8 - state->map_position.y + clipped_height / 8 <= state->rows);

  /* Calculate Y plotting offset.
   * The full calculation can be avoided if there are rows to skip since
   * the sprite is always aligned to the top of the screen in that case. */
  y = 0; /* Conv: Moved. */
  if (top_skip == 0) /* no rows to skip */
    y = (vischar->isopos.y - state->map_position.y * 8) * state->columns;

  assert(y / 8 / state->columns < state->rows);

  /* Calculate X plotting offset. */
  x = state->isopos.x - state->map_position.x; // signed subtract + extend to 16-bit

  assert(x >= -3 && x <= state->columns - 1); // found empirically

  state->window_buf_pointer = &state->window_buf[x + y];

  /* Note that it _is_ valid for window_buf_pointer to point outside of
   * window_buf. It can point beyond the end by up to the width of the sprite
   * (vischar->width_bytes - 1) [char->width_bytes is (vischar width in
   * bytes + 1)] and that's fine since the clipping enable flags ensure that
   * those locations are never written to.
   */

  ASSERT_WINDOW_BUF_PTR_VALID(state->window_buf_pointer, vischar->width_bytes - 1);
  ASSERT_WINDOW_BUF_PTR_VALID(state->window_buf_pointer + (clipped_height - 1) * state->columns + clipped_width - 1, vischar->width_bytes - 1);

  maskbuf = &state->mask_buffer[0];

  // POP DE_clipped_height
  // PUSH DE

  assert((top_skip * 4 + (vischar->isopos.y & 7) * 4) < 255);

  maskbuf += top_skip * 4 + (vischar->isopos.y & 7) * 4;
  ASSERT_MASK_BUF_PTR_VALID(maskbuf);
  state->foreground_mask_pointer = maskbuf;

  // POP DE_clipped_height

  A = top_skip; // offset/skip
  if (A)
  {
    /* Conv: The original game has a generic multiply loop here. In this
     * version instead we'll just multiply. */

    A *= vischar->width_bytes - 1;
    // top_skip = 0
  }

  /* D ends up as zero either way. */

  skip = A;
  state->bitmap_pointer += skip;
  state->mask_pointer   += skip;

  // POP clipped_width  // why save it anyway? if it's just getting popped. unless it's being returned.

  return 1; /* visible */ // Conv: Added.
}